

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O1

int mem_write(int hdl,void *buffer,long nbytes)

{
  memdriver *pmVar1;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  long lVar5;
  
  pmVar1 = memTable + hdl;
  uVar2 = memTable[hdl].currentpos + nbytes;
  if (*memTable[hdl].memsizeptr < uVar2) {
    if (memTable[hdl].mem_realloc == (_func_void_ptr_void_ptr_size_t *)0x0) {
      ffpmsg("realloc function not defined (mem_write)");
      return 0x6a;
    }
    uVar3 = ((long)(uVar2 - 1) / 0xb40) * 0xb40 + 0xb40;
    uVar2 = *memTable[hdl].memsizeptr + memTable[hdl].deltasize;
    if (uVar2 < uVar3) {
      uVar2 = uVar3;
    }
    pcVar4 = (char *)(*memTable[hdl].mem_realloc)(*pmVar1->memaddrptr,uVar2);
    if (pcVar4 == (char *)0x0) {
      ffpmsg("Failed to reallocate memory (mem_write)");
      return 0x71;
    }
    *pmVar1->memaddrptr = pcVar4;
    *memTable[hdl].memsizeptr = uVar2;
  }
  memcpy(*pmVar1->memaddrptr + memTable[hdl].currentpos,buffer,nbytes);
  lVar5 = nbytes + memTable[hdl].currentpos;
  memTable[hdl].currentpos = lVar5;
  if (lVar5 < memTable[hdl].fitsfilesize) {
    lVar5 = memTable[hdl].fitsfilesize;
  }
  memTable[hdl].fitsfilesize = lVar5;
  return 0;
}

Assistant:

int mem_write(int hdl, void *buffer, long nbytes)
/*
  write bytes at the current position in the file
*/
{
    size_t newsize;
    char *ptr;

    if ((size_t) (memTable[hdl].currentpos + nbytes) > 
         *(memTable[hdl].memsizeptr) )
    {
               
        if (!(memTable[hdl].mem_realloc))
        {
            ffpmsg("realloc function not defined (mem_write)");
            return(WRITE_ERROR);
        }

        /*
          Attempt to reallocate additional memory:
          the memory buffer size is incremented by the larger of:
             1 FITS block (2880 bytes) or
             the defined 'deltasize' parameter
         */

        newsize = maxvalue( (size_t)
            (((memTable[hdl].currentpos + nbytes - 1) / 2880) + 1) * 2880,
            *(memTable[hdl].memsizeptr) + memTable[hdl].deltasize);

        /* call the realloc function */
        ptr = (memTable[hdl].mem_realloc)(
                                    *(memTable[hdl].memaddrptr),
                                     newsize);
        if (!ptr)
        {
            ffpmsg("Failed to reallocate memory (mem_write)");
            return(MEMORY_ALLOCATION);
        }

        *(memTable[hdl].memaddrptr) = ptr;
        *(memTable[hdl].memsizeptr) = newsize;
    }

    /* now copy the bytes from the buffer into memory */
    memcpy( *(memTable[hdl].memaddrptr) + memTable[hdl].currentpos,
             buffer,
             nbytes);

    memTable[hdl].currentpos += nbytes;
    memTable[hdl].fitsfilesize =
               maxvalue(memTable[hdl].fitsfilesize,
                        memTable[hdl].currentpos);
    return(0);
}